

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

_Bool parse_paint(element_t *element,int id,paint_t *paint)

{
  byte *end;
  byte bVar1;
  size_t sVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  char *it;
  attribute *paVar6;
  byte *pbVar7;
  byte *pbVar8;
  char *pcVar9;
  char cVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  string_t *unaff_R12;
  bool bVar14;
  byte *local_38;
  
  do {
    for (paVar6 = element->attributes; paVar6 != (attribute *)0x0; paVar6 = paVar6->next) {
      if (paVar6->id == id) {
        if (((paVar6->value).length == 7) &&
           (iVar5 = strncmp((paVar6->value).data,"inherit",7), iVar5 == 0)) {
          bVar14 = true;
        }
        else {
          bVar14 = false;
          unaff_R12 = &paVar6->value;
        }
        if (!bVar14) {
          pbVar7 = (byte *)0x0;
          goto LAB_00108760;
        }
        break;
      }
    }
    element = element->parent;
    pbVar7 = (byte *)0x1;
LAB_00108760:
    if ((char)pbVar7 == '\0') goto LAB_0010877c;
  } while (element != (element_t *)0x0);
  unaff_R12 = (string_t *)0x0;
LAB_0010877c:
  if (unaff_R12 != (string_t *)0x0) {
    local_38 = (byte *)unaff_R12->data;
    sVar2 = unaff_R12->length;
    end = local_38 + sVar2;
    if ((long)sVar2 < 1) {
      pbVar8 = local_38;
      pcVar9 = "none";
    }
    else {
      sVar12 = 0;
      do {
        pbVar8 = local_38 + 4;
        pcVar9 = "";
        if (sVar12 == 4) break;
        if (local_38[sVar12] != "none"[sVar12]) {
          pbVar8 = local_38 + sVar12;
          pcVar9 = "none" + sVar12;
          break;
        }
        sVar12 = sVar12 + 1;
        pbVar8 = end;
        pcVar9 = "none" + sVar2;
      } while (sVar2 != sVar12);
    }
    if (*pcVar9 == '\0') {
      paint->type = paint_type_none;
      pbVar7 = pbVar8;
      if (pbVar8 < end) {
        do {
          pbVar7 = pbVar8;
          if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
          break;
          pbVar8 = pbVar8 + 1;
          pbVar7 = end;
        } while (pbVar8 != end);
      }
    }
    else {
      if (local_38 < end) {
        lVar13 = 0;
        do {
          pbVar7 = local_38 + 3;
          pcVar9 = "";
          if (lVar13 == 3) break;
          if (local_38[lVar13] != "url"[lVar13]) {
            pbVar7 = local_38 + lVar13;
            pcVar9 = "url" + lVar13;
            break;
          }
          lVar3 = lVar13 + 1;
          lVar13 = lVar13 + 1;
          pbVar7 = end;
          pcVar9 = "url" + ((long)end - (long)local_38);
        } while (local_38 + lVar3 != end);
      }
      else {
        pbVar7 = local_38;
        pcVar9 = "url";
      }
      if (*pcVar9 == '\0') {
        bVar14 = pbVar7 < end;
        pbVar8 = pbVar7;
        if (bVar14) {
          bVar14 = true;
          do {
            pbVar8 = pbVar7;
            if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))
            break;
            pbVar7 = pbVar7 + 1;
            bVar14 = pbVar7 < end;
            pbVar8 = end;
          } while (pbVar7 != end);
        }
        if (bVar14) {
          bVar14 = false;
          if (pbVar8 < end) {
            bVar14 = *pbVar8 == 0x28;
            pbVar8 = pbVar8 + bVar14;
          }
          if (bVar14) {
            bVar14 = pbVar8 < end;
            pbVar7 = pbVar8;
            if (bVar14) {
              bVar14 = true;
              do {
                pbVar7 = pbVar8;
                if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
                break;
                pbVar8 = pbVar8 + 1;
                bVar14 = pbVar8 < end;
                pbVar7 = end;
              } while (pbVar8 != end);
            }
            if (bVar14) {
              bVar14 = false;
              if (pbVar7 < end) {
                bVar14 = *pbVar7 == 0x23;
                pbVar7 = pbVar7 + bVar14;
              }
              if (bVar14) {
                (paint->id).data = (char *)pbVar7;
                (paint->id).length = 0;
                if (pbVar7 < end) {
                  uVar11 = 1;
                  if (*pbVar7 != 0x29) {
                    sVar12 = (paint->id).length;
                    pbVar8 = local_38 + ~(ulong)pbVar7 + sVar2;
                    do {
                      sVar12 = sVar12 + 1;
                      (paint->id).length = sVar12;
                      if (pbVar8 == (byte *)0x0) {
                        cVar10 = '\0';
                        pbVar7 = end;
                        goto LAB_001089b2;
                      }
                      pbVar7 = pbVar7 + 1;
                      pbVar8 = pbVar8 + -1;
                    } while (*pbVar7 != 0x29);
                    uVar11 = (ulong)(pbVar7 < end);
                  }
                  cVar10 = (char)uVar11;
                  pbVar7 = pbVar7 + uVar11;
                }
                else {
                  cVar10 = '\0';
                }
LAB_001089b2:
                if (cVar10 != '\0') {
                  pbVar8 = pbVar7;
                  if (pbVar7 < end) {
                    do {
                      pbVar8 = pbVar7;
                      if ((0x20 < (ulong)*pbVar7) ||
                         ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
                      pbVar7 = pbVar7 + 1;
                      pbVar8 = end;
                    } while (pbVar7 != end);
                  }
                  paint->type = paint_type_url;
                  (paint->color).value = 0;
                  bVar14 = pbVar8 < end;
                  local_38 = pbVar8;
                  if (bVar14) {
                    bVar14 = true;
                    do {
                      local_38 = pbVar8;
                      if ((0x20 < (ulong)*pbVar8) ||
                         ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) break;
                      pbVar8 = pbVar8 + 1;
                      bVar14 = pbVar8 < end;
                      local_38 = end;
                    } while (pbVar8 != end);
                  }
                  pbVar7 = local_38;
                  if (bVar14) {
                    _Var4 = parse_color_value((char **)&local_38,(char *)end,&paint->color);
                    pbVar7 = (byte *)(ulong)_Var4;
                  }
                  goto LAB_00108d19;
                }
              }
            }
          }
        }
      }
      if (local_38 < end) {
        lVar13 = 0;
        do {
          pbVar8 = local_38 + 3;
          pcVar9 = "";
          if (lVar13 == 3) break;
          if (local_38[lVar13] != "var"[lVar13]) {
            pbVar8 = local_38 + lVar13;
            pcVar9 = "var" + lVar13;
            break;
          }
          lVar3 = lVar13 + 1;
          lVar13 = lVar13 + 1;
          pbVar8 = end;
          pcVar9 = "var" + ((long)end - (long)local_38);
        } while (local_38 + lVar3 != end);
      }
      else {
        pbVar8 = local_38;
        pcVar9 = "var";
      }
      if (*pcVar9 == '\0') {
        bVar14 = pbVar8 < end;
        pbVar7 = pbVar8;
        if (bVar14) {
          bVar14 = true;
          do {
            pbVar7 = pbVar8;
            if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
            break;
            pbVar8 = pbVar8 + 1;
            bVar14 = pbVar8 < end;
            pbVar7 = end;
          } while (pbVar8 != end);
        }
        if (((bVar14) && (pbVar7 < end)) && (*pbVar7 == 0x28)) {
          pbVar8 = pbVar7 + 1;
          bVar14 = pbVar8 < end;
          pbVar7 = pbVar8;
          if (bVar14) {
            bVar14 = true;
            do {
              pbVar7 = pbVar8;
              if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
              break;
              pbVar8 = pbVar8 + 1;
              bVar14 = pbVar8 < end;
              pbVar7 = end;
            } while (pbVar8 != end);
          }
          if (bVar14) {
            if (pbVar7 < end) {
              lVar13 = 0;
              do {
                pbVar8 = pbVar7 + 2;
                pcVar9 = "";
                if (lVar13 == 2) break;
                if (pbVar7[lVar13] != "--"[lVar13]) {
                  pbVar8 = pbVar7 + lVar13;
                  pcVar9 = "--" + lVar13;
                  break;
                }
                lVar3 = lVar13 + 1;
                lVar13 = lVar13 + 1;
                pbVar8 = end;
                pcVar9 = "--" + ((long)end - (long)pbVar7);
              } while (pbVar7 + lVar3 != end);
            }
            else {
              pbVar8 = pbVar7;
              pcVar9 = "--";
            }
            pbVar7 = pbVar8;
            if (*pcVar9 == '\0') {
              for (; (pbVar7 < end &&
                     (((bVar1 = *pbVar7, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a || (bVar1 == 0x3a)) ||
                      ((bVar1 == 0x5f || ((byte)(bVar1 - 0x30) < 10 || (byte)(bVar1 - 0x2d) < 2)))))
                     ); pbVar7 = pbVar7 + 1) {
              }
              paint->type = paint_type_var;
              (paint->id).data = (char *)pbVar8;
              (paint->id).length = (long)pbVar7 - (long)pbVar8;
              (paint->color).value = 0;
              local_38 = pbVar7;
              if (pbVar7 < end) {
                do {
                  local_38 = pbVar7;
                  if ((0x20 < (ulong)*pbVar7) ||
                     ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
                  pbVar7 = pbVar7 + 1;
                  local_38 = end;
                } while (pbVar7 != end);
              }
              if ((local_38 < end) && (*local_38 == 0x2c)) {
                pbVar7 = local_38 + 1;
                local_38 = pbVar7;
                if (pbVar7 < end) {
                  do {
                    local_38 = pbVar7;
                    if ((0x20 < (ulong)*pbVar7) ||
                       ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
                    pbVar7 = pbVar7 + 1;
                    local_38 = end;
                  } while (pbVar7 != end);
                }
                _Var4 = parse_color_value((char **)&local_38,(char *)end,&paint->color);
                pbVar7 = (byte *)(ulong)_Var4;
                if (!_Var4) goto LAB_00108d19;
              }
              pbVar7 = local_38;
              if (((local_38 < end) && (*local_38 == 0x29)) &&
                 (local_38 = local_38 + 1, pbVar7 = local_38, local_38 < end)) {
                do {
                  pbVar7 = local_38;
                  if ((0x20 < (ulong)*local_38) ||
                     ((0x100002600U >> ((ulong)*local_38 & 0x3f) & 1) == 0)) break;
                  local_38 = local_38 + 1;
                  pbVar7 = end;
                } while (local_38 != end);
              }
            }
          }
        }
      }
      else {
        _Var4 = parse_color_value((char **)&local_38,(char *)end,&paint->color);
        pbVar7 = (byte *)(ulong)_Var4;
        if (_Var4) {
          paint->type = paint_type_color;
        }
      }
    }
  }
LAB_00108d19:
  return SUB81(pbVar7,0);
}

Assistant:

static bool parse_paint(const element_t* element, int id, paint_t* paint)
{
    const string_t* value = find_attribute(element, id, true);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none")) {
        paint->type = paint_type_none;
        return !skip_ws(&it, end);
    }

    if(parse_url_value(&it, end, &paint->id)) {
        paint->type = paint_type_url;
        paint->color.value = 0x00000000;
        if(skip_ws(&it, end)) {
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return it == end;
    }

    if(skip_string(&it, end, "var")) {
        if(!skip_ws(&it, end)
            || !skip_delim(&it, end, '(')
            || !skip_ws(&it, end)) {
            return false;
        }

        if(!skip_string(&it, end, "--"))
            return false;
        const char* begin = it;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        paint->type = paint_type_var;
        paint->id.data = begin;
        paint->id.length = it - begin;
        paint->color.value = 0x00000000;
        skip_ws(&it, end);
        if(skip_delim(&it, end, ',')) {
            skip_ws(&it, end);
            if(!parse_color_value(&it, end, &paint->color)) {
                return false;
            }
        }

        return skip_delim(&it, end, ')') && !skip_ws(&it, end);
    }

    if(parse_color_value(&it, end, &paint->color)) {
        paint->type = paint_type_color;
        return it == end;
    }

    return false;
}